

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

t_object * xemmai::t_type_of<std::filesystem::file_type>::f_define(t_library *a_library)

{
  t_object *ptVar1;
  t_library *a_library_local;
  
  ptVar1 = t_enum_of<std::filesystem::file_type,xemmai::t_os>::
           f_define<xemmai::t_type_of<std::filesystem::file_type>::f_define(xemmai::t_os*)::_lambda(auto:1)_1_>
                     (a_library);
  return ptVar1;
}

Assistant:

static t_object* f_define(t_library* a_library)
	{
		return t_base::f_define(a_library, [](auto a_fields)
		{
			a_fields
			(L"NONE"sv, std::filesystem::file_type::none)
			(L"NOT_FOUND"sv, std::filesystem::file_type::not_found)
			(L"REGULAR"sv, std::filesystem::file_type::regular)
			(L"DIRECTORY"sv, std::filesystem::file_type::directory)
			(L"SYMLINK"sv, std::filesystem::file_type::symlink)
			(L"BLOCK"sv, std::filesystem::file_type::block)
			(L"CHARACTER"sv, std::filesystem::file_type::character)
			(L"FIFO"sv, std::filesystem::file_type::fifo)
			(L"SOCKET"sv, std::filesystem::file_type::socket)
			(L"UNKNOWN"sv, std::filesystem::file_type::unknown)
			;
		});
	}